

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall
minibag::View::View(View *this,Bag *bag,function<bool_(const_minibag::ConnectionInfo_*)> *query,
                   Time *start_time,Time *end_time,bool *reduce_overlap)

{
  function<bool_(const_minibag::ConnectionInfo_*)> *in_RDX;
  function<bool_(const_minibag::ConnectionInfo_*)> *in_RDI;
  byte *in_R9;
  Time *in_stack_00000020;
  Time *in_stack_00000028;
  function<bool_(const_minibag::ConnectionInfo_*)> *in_stack_00000030;
  Bag *in_stack_00000038;
  View *in_stack_00000040;
  
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::vector
            ((vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *)0x17af46);
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::vector
            ((vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *)0x17af59);
  *(undefined4 *)&in_RDI[1].super__Function_base._M_manager = 0;
  *(undefined4 *)((long)&in_RDI[1].super__Function_base._M_manager + 4) = 0;
  *(undefined4 *)&in_RDI[1]._M_invoker = 0;
  *(byte *)((long)&in_RDI[1]._M_invoker + 4) = *in_R9 & 1;
  std::function<bool_(const_minibag::ConnectionInfo_*)>::function(in_RDX,in_RDI);
  addQuery(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020
          );
  std::function<bool_(const_minibag::ConnectionInfo_*)>::~function
            ((function<bool_(const_minibag::ConnectionInfo_*)> *)0x17afc4);
  return;
}

Assistant:

View::View(Bag const& bag, std::function<bool(ConnectionInfo const*)> query, miniros::Time const& start_time, miniros::Time const& end_time, bool const& reduce_overlap) : view_revision_(0), size_cache_(0), size_revision_(0), reduce_overlap_(reduce_overlap) {
	addQuery(bag, query, start_time, end_time);
}